

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Varint64::_Run(_Test_Varint64 *this)

{
  ulong uVar1;
  char *pcVar2;
  reference pvVar3;
  char *pcVar4;
  long lVar5;
  size_type sVar6;
  Tester local_8f8;
  long local_758;
  int local_74c;
  Tester local_748;
  Tester local_5a8;
  Tester local_408;
  char *local_268;
  char *start;
  uint64_t actual;
  ulong local_b8;
  size_t i_1;
  char *limit;
  char *p;
  size_t i;
  string s;
  value_type_conflict local_78;
  value_type_conflict local_70;
  value_type_conflict local_68;
  uint64_t power;
  value_type_conflict vStack_58;
  uint32_t k;
  value_type_conflict local_50 [4];
  value_type_conflict local_30;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  _Test_Varint64 *this_local;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_30 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,&local_30);
  local_50[1] = 100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,local_50 + 1);
  local_50[0] = 0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,local_50);
  vStack_58 = 0xfffffffffffffffe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,
             &stack0xffffffffffffffa8);
  for (power._4_4_ = 0; power._4_4_ < 0x40; power._4_4_ = power._4_4_ + 1) {
    local_68 = 1L << (power._4_1_ & 0x3f);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,&local_68);
    local_70 = local_68 - 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,&local_70);
    local_78 = local_68 + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,&local_78);
  }
  std::__cxx11::string::string((string *)&i);
  p = (char *)0x0;
  while( true ) {
    pcVar4 = p;
    pcVar2 = (char *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
    if (pcVar2 <= pcVar4) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,
                        (size_type)p);
    PutVarint64((string *)&i,*pvVar3);
    p = p + 1;
  }
  pcVar4 = (char *)std::__cxx11::string::data();
  limit = pcVar4;
  lVar5 = std::__cxx11::string::size();
  i_1 = (size_t)(pcVar4 + lVar5);
  local_b8 = 0;
  while( true ) {
    uVar1 = local_b8;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
    if (sVar6 <= uVar1) break;
    test::Tester::Tester
              ((Tester *)&actual,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x7b);
    test::Tester::Is((Tester *)&actual,limit < i_1,"p < limit");
    test::Tester::~Tester((Tester *)&actual);
    local_268 = limit;
    limit = GetVarint64Ptr(limit,(char *)i_1,(uint64_t *)&start);
    test::Tester::Tester
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x7f);
    test::Tester::Is(&local_408,limit != (char *)0x0,"p != nullptr");
    test::Tester::~Tester(&local_408);
    test::Tester::Tester
              (&local_5a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x80);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,local_b8);
    test::Tester::IsEq<unsigned_long,unsigned_long>(&local_5a8,pvVar3,(unsigned_long *)&start);
    test::Tester::~Tester(&local_5a8);
    test::Tester::Tester
              (&local_748,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x81);
    local_74c = VarintLength((uint64_t)start);
    local_758 = (long)limit - (long)local_268;
    test::Tester::IsEq<int,long>(&local_748,&local_74c,&local_758);
    test::Tester::~Tester(&local_748);
    local_b8 = local_b8 + 1;
  }
  test::Tester::Tester
            (&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x83);
  test::Tester::IsEq<char_const*,char_const*>(&local_8f8,&limit,(char **)&i_1);
  test::Tester::~Tester(&local_8f8);
  std::__cxx11::string::~string((string *)&i);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  return;
}

Assistant:

TEST(Coding, Varint64) {
  // Construct the list of values to check
  std::vector<uint64_t> values;
  // Some special values
  values.push_back(0);
  values.push_back(100);
  values.push_back(~static_cast<uint64_t>(0));
  values.push_back(~static_cast<uint64_t>(0) - 1);
  for (uint32_t k = 0; k < 64; k++) {
    // Test values near powers of two
    const uint64_t power = 1ull << k;
    values.push_back(power);
    values.push_back(power - 1);
    values.push_back(power + 1);
  }

  std::string s;
  for (size_t i = 0; i < values.size(); i++) {
    PutVarint64(&s, values[i]);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (size_t i = 0; i < values.size(); i++) {
    ASSERT_TRUE(p < limit);
    uint64_t actual;
    const char* start = p;
    p = GetVarint64Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(values[i], actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, limit);
}